

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

int __thiscall llama_context::decode(llama_context *this,llama_batch *inp_batch)

{
  float *pfVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  llama_model *plVar4;
  llama_kv_cache_unified *plVar5;
  _Base_ptr p_Var6;
  pointer plVar7;
  pointer plVar8;
  pointer piVar9;
  llama_batch in_batch;
  bool bVar10;
  llama_pos lVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  int32_t iVar14;
  uint32_t uVar15;
  ggml_status gVar16;
  int64_t iVar17;
  llama_ubatch *ubatch_00;
  long lVar18;
  long lVar19;
  mapped_type *pmVar20;
  runtime_error *this_00;
  uint uVar21;
  _Base_ptr p_Var22;
  char *pcVar23;
  long lVar24;
  _Rb_tree_header *p_Var25;
  byte bVar26;
  ulong uVar27;
  undefined8 uVar28;
  long lVar29;
  long lVar30;
  float fVar31;
  llama_seq_id seq_id;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *embd_seq_out;
  llama_ubatch ubatch;
  llm_graph_result_ptr res;
  llama_batch_allocr batch_allocr;
  int local_200;
  byte local_1f9;
  long local_1f8;
  char *local_1f0;
  ulong local_1e8;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_1e0;
  llama_kv_cache_unified *local_1d8;
  long local_1d0;
  long local_1c8;
  uint32_t local_1bc;
  undefined1 local_1b8 [48];
  undefined8 local_188;
  undefined8 uStack_180;
  char *local_178;
  char *local_170;
  llama_cparams *local_168;
  long local_160;
  undefined1 local_158 [80];
  ggml_backend_sched_eval_callback local_108;
  llama_token *plStack_100;
  float *local_f8;
  pointer puStack_f0;
  pointer local_e8;
  pointer puStack_e0;
  pointer local_d8;
  llama_batch_allocr local_d0;
  
  if (inp_batch->n_tokens == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: n_tokens == 0\n","decode");
    return 0xffffffff;
  }
  local_d8 = (pointer)inp_batch->logits;
  local_108 = *(ggml_backend_sched_eval_callback *)inp_batch;
  plStack_100 = inp_batch->token;
  local_f8 = inp_batch->embd;
  puStack_f0 = (pointer)inp_batch->pos;
  local_e8 = (pointer)inp_batch->n_seq_id;
  puStack_e0 = (pointer)inp_batch->seq_id;
  lVar11 = -1;
  if (inp_batch->pos == (llama_pos *)0x0) {
    lVar11 = llama_kv_cache_unified::pos_max
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    lVar11 = lVar11 + 1;
  }
  in_batch.token = plStack_100;
  in_batch._0_8_ = local_108;
  in_batch.embd = local_f8;
  in_batch.pos = (llama_pos *)puStack_f0;
  in_batch.n_seq_id = (int32_t *)local_e8;
  in_batch.seq_id = (llama_seq_id **)puStack_e0;
  in_batch.logits = (int8_t *)local_d8;
  llama_batch_allocr::llama_batch_allocr(&local_d0,in_batch,lVar11);
  plVar4 = this->model;
  uVar12 = llama_vocab::n_tokens(&plVar4->vocab);
  local_1d8 = (this->kv_self)._M_t.
              super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ._M_t.
              super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
              .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
  if (((pointer)local_d0.batch.embd == (pointer)0x0) ==
      ((pointer)local_d0.batch.token == (pointer)0x0)) {
    pcVar23 = "(!batch.token && batch.embd) || (batch.token && !batch.embd)";
    uVar28 = 0x4bb;
  }
  else {
    local_1c8 = (long)local_d0.batch.n_tokens;
    local_1e8 = (ulong)(plVar4->hparams).n_embd;
    if (0 < local_d0.batch.n_tokens && (pointer)local_d0.batch.token != (pointer)0x0) {
      lVar30 = 0;
      do {
        uVar21 = *(uint *)((long)&(((__uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>
                                     *)local_d0.batch.token)->
                                  super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>
                                  )._M_t.
                                  super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>
                                  .super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl
                          + lVar30 * 4);
        if (((int)uVar21 < 0) ||
           (uVar13 = llama_vocab::n_tokens(&this->model->vocab), uVar13 <= uVar21)) {
          llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid token[%ld] = %d\n","decode",lVar30,
                             (ulong)*(uint *)((long)&(((
                                                  __uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>
                                                  *)local_d0.batch.token)->
                                                  super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>
                                                  )._M_t.
                                                  super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>
                                                  .
                                                  super__Head_base<0UL,_ggml_backend_buffer_*,_false>
                                                  ._M_head_impl + lVar30 * 4));
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"invalid token");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar30 = lVar30 + 1;
      } while (local_1c8 != lVar30);
    }
    lVar30 = local_1c8;
    if ((long)(ulong)(this->cparams).n_batch < local_1c8) {
      pcVar23 = "n_tokens_all <= cparams.n_batch";
      uVar28 = 0x4c6;
    }
    else {
      if (((this->cparams).causal_attn != false) ||
         (local_1c8 <= (long)(ulong)(this->cparams).n_ubatch)) {
        if (this->t_compute_start_us == 0) {
          iVar17 = ggml_time_us();
          this->t_compute_start_us = iVar17;
        }
        this->n_queued_tokens = this->n_queued_tokens + lVar30;
        bVar26 = (this->cparams).pooling_type != LLAMA_POOLING_TYPE_NONE &
                 (this->cparams).embeddings;
        local_1e0 = &this->embd_seq;
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::clear(&local_1e0->_M_t);
        if (local_d0.batch.logits == (int8_t *)0x0 || bVar26 != 0) {
          lVar29 = 1;
          if ((this->logits_all & 1U) != 0 || bVar26 != 0) {
            lVar29 = lVar30;
          }
        }
        else if ((int)lVar30 < 1) {
          lVar29 = 0;
        }
        else {
          lVar18 = 0;
          lVar29 = 0;
          do {
            lVar29 = (lVar29 + 1) - (ulong)(local_d0.batch.logits[lVar18] == '\0');
            lVar18 = lVar18 + 1;
          } while (lVar30 != lVar18);
        }
        local_1f9 = bVar26;
        llama_sbatch::from_batch
                  (&this->sbatch,&local_d0.batch,local_1e8,
                   (bool)(((this->kv_self)._M_t.
                           super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                           .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->
                          recurrent ^ 1),lVar29 == lVar30);
        iVar14 = output_reserve(this,(int32_t)lVar29);
        if (iVar14 < lVar29) {
          uVar12 = 0xfffffffe;
          llama_log_internal(GGML_LOG_LEVEL_ERROR,
                             "%s: could not reserve space for batch with %ld outputs\n","decode",
                             lVar29);
        }
        else {
          kv_self_update(this);
          local_168 = &this->cparams;
          local_158._64_8_ = SEXT48((int)uVar12);
          p_Var2 = &(this->embd_seq)._M_t._M_impl.super__Rb_tree_header;
          local_160 = local_1e8 * 4;
          local_1f8 = 0;
          local_170 = "backend_res != nullptr";
          local_1f0 = "n_outputs_prev + n_outputs <= n_outputs_all";
          local_178 = "backend_embd != nullptr";
          local_158._72_8_ = &this->sbatch;
          do {
            if (*(size_t *)local_158._72_8_ == 0) {
              (*(local_1d8->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[10])();
              plVar7 = (this->sbatch).out_ids.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              plVar8 = (this->sbatch).out_ids.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if ((long)plVar8 - (long)plVar7 >> 3 != lVar29) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                           ,0x59e,"GGML_ASSERT(%s) failed",
                           "sbatch.out_ids.size() == (size_t) n_outputs_all");
              }
              if (lVar29 < 1) {
                bVar10 = true;
              }
              else {
                piVar9 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                bVar10 = true;
                lVar30 = 0;
                do {
                  lVar18 = plVar7[lVar30];
                  piVar9[lVar18] = (int)lVar30;
                  if (lVar30 != lVar18) {
                    bVar10 = false;
                  }
                  lVar30 = lVar30 + 1;
                } while (lVar29 != lVar30);
              }
              if ((plVar8 != plVar7) && (bVar10)) {
                (this->sbatch).out_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish = plVar7;
              }
              this->n_outputs = (int32_t)lVar29;
              if (((this->cparams).causal_attn == true) &&
                 (fVar31 = 0.0, 0.0 < (this->cparams).defrag_thold)) {
                plVar5 = (this->kv_self)._M_t.
                         super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                         .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
                if (0x7ff < plVar5->n) {
                  uVar12 = plVar5->used;
                  uVar13 = llama_kv_cache_unified::get_padding(plVar5,local_168);
                  fVar31 = 1.0 - (float)(uVar13 + uVar12) /
                                 (float)((this->kv_self)._M_t.
                                         super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                                         .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>.
                                        _M_head_impl)->n;
                  if (fVar31 <= 0.0) {
                    fVar31 = 0.0;
                  }
                }
                pfVar1 = &(this->cparams).defrag_thold;
                if (*pfVar1 <= fVar31 && fVar31 != *pfVar1) {
                  llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                     "%s: fragmentation: %.2f - requesting defrag\n",
                                     SUB84((double)fVar31,0),"decode");
                  (**(code **)((long)(((this->kv_self)._M_t.
                                       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                                       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>.
                                      _M_head_impl)->super_llama_kv_cache).super_llama_memory_i + 8)
                  )();
                }
              }
              uVar12 = 0;
              ggml_backend_sched_reset
                        ((this->sched)._M_t.
                         super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                         super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
              break;
            }
            local_188 = (llama_seq_id **)0x0;
            uStack_180 = (int8_t *)0x0;
            local_1b8._32_8_ = (llama_pos *)0x0;
            local_1b8._40_8_ = (int32_t *)0x0;
            local_1b8._16_8_ = (llama_token *)0x0;
            local_1b8._24_8_ = (float *)0x0;
            local_1b8[0] = false;
            local_1b8._1_3_ = 0;
            local_1b8._4_4_ = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = 0;
            if (((this->kv_self)._M_t.
                 super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                 .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->recurrent ==
                true) {
              if (local_1f9 == 0) {
                llama_sbatch::split_equal
                          ((llama_ubatch *)local_158,(llama_sbatch *)local_158._72_8_,
                           (ulong)(this->cparams).n_ubatch);
              }
              else {
                llama_sbatch::split_seq
                          ((llama_ubatch *)local_158,(llama_sbatch *)local_158._72_8_,
                           (ulong)(this->cparams).n_ubatch);
              }
            }
            else {
              llama_sbatch::split_simple
                        ((llama_ubatch *)local_158,(llama_sbatch *)local_158._72_8_,
                         (ulong)(this->cparams).n_ubatch);
            }
            local_188 = (llama_seq_id **)CONCAT44(local_158._52_4_,local_158._48_4_);
            uStack_180 = (int8_t *)CONCAT44(local_158._60_4_,local_158._56_4_);
            local_1b8._4_4_ = local_158._4_4_;
            local_1b8._8_8_ = (ulong)(uint)local_158._12_4_ << 0x20;
            uVar21 = local_158._4_4_;
            if (lVar29 != lVar30) {
              if (uStack_180 == (int8_t *)0x0) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                           ,0x50c,"GGML_ASSERT(%s) failed","ubatch.output");
              }
              if ((ulong)(uint)local_158._4_4_ == 0) {
                uVar21 = 0;
              }
              else {
                uVar27 = 0;
                uVar21 = 0;
                do {
                  uVar21 = (uVar21 + 1) - (uint)(uStack_180[uVar27] == '\0');
                  uVar27 = uVar27 + 1;
                } while ((uint)local_158._4_4_ != uVar27);
              }
            }
            this->n_outputs = uVar21;
            bVar10 = llama_kv_cache_unified::find_slot
                               ((this->kv_self)._M_t.
                                super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                                .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl
                                ,(llama_ubatch *)local_1b8);
            if (bVar10) {
              plVar5 = (this->kv_self)._M_t.
                       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
              if (plVar5->recurrent == false) {
                uVar13 = llama_kv_cache_unified::get_padding(plVar5,local_168);
                plVar5 = (this->kv_self)._M_t.
                         super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                         .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
                uVar15 = llama_kv_cache_unified::cell_max(plVar5);
                uVar21 = -uVar13 & (uVar15 + uVar13) - 1;
                if (uVar21 < uVar13) {
                  uVar21 = uVar13;
                }
                uVar3 = plVar5->size;
                if (uVar3 <= uVar21) {
                  uVar21 = uVar3;
                }
                ((this->kv_self)._M_t.
                 super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                 .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->n = uVar21;
              }
              ggml_backend_sched_reset
                        ((this->sched)._M_t.
                         super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                         super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
              ggml_backend_sched_set_eval_callback
                        ((this->sched)._M_t.
                         super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                         super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,
                         (this->cparams).cb_eval,(this->cparams).cb_eval_user_data);
              ubatch_00 = (llama_ubatch *)graph_init(this);
              graph_build((llama_context *)local_158,(ggml_context *)this,
                          (ggml_cgraph *)
                          (this->ctx_compute)._M_t.
                          super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,ubatch_00,
                          (llm_graph_type)local_1b8);
              ggml_backend_sched_alloc_graph
                        ((this->sched)._M_t.
                         super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                         super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,ubatch_00);
              (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 0x28))
                        ((long *)CONCAT44(local_158._4_4_,local_158._0_4_),local_1b8);
              gVar16 = graph_compute(this,(ggml_cgraph *)ubatch_00,1 < (uint)local_1b8._4_4_);
              bVar10 = gVar16 == GGML_STATUS_SUCCESS;
              if (bVar10) {
                local_1bc = uVar12;
                if ((this->cparams).embeddings == false) {
                  lVar30 = (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 0x10))
                                     ();
                }
                else {
                  lVar30 = 0;
                }
                if ((this->cparams).embeddings == true) {
                  lVar18 = (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 0x18))
                                     ();
                }
                else {
                  lVar18 = 0;
                }
                if (lVar18 == 0) {
                  lVar18 = 0;
                }
                else {
                  lVar19 = (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 0x20))
                                     ();
                  if (lVar19 != 0) {
                    lVar18 = (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 0x20)
                             )();
                  }
                }
                if ((lVar30 != 0) && (0 < this->n_outputs)) {
                  lVar19 = ggml_backend_sched_get_tensor_backend
                                     ((this->sched)._M_t.
                                      super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>
                                      .super__Head_base<0UL,_ggml_backend_sched_*,_false>.
                                      _M_head_impl,lVar30);
                  if (lVar19 == 0) {
                    uVar28 = 0x551;
LAB_00190064:
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                               ,uVar28,"GGML_ASSERT(%s) failed",local_170);
                  }
                  if (this->logits == (float *)0x0) {
                    uVar28 = 0x552;
                    local_170 = "logits != nullptr";
                    goto LAB_00190064;
                  }
                  if ((long)this->n_outputs != 0) {
                    lVar24 = local_1f8 + this->n_outputs;
                    if (lVar29 < lVar24) {
                      uVar28 = 0x557;
LAB_00190099:
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                                 ,uVar28,"GGML_ASSERT(%s) failed",local_1f0);
                    }
                    lVar24 = lVar24 * local_158._64_8_;
                    if (lVar24 - this->logits_size != 0 && (long)this->logits_size <= lVar24) {
                      uVar28 = 0x558;
                      local_1f0 = "(n_outputs_prev + n_outputs)*n_vocab <= (int64_t) logits_size";
                      goto LAB_00190099;
                    }
                    ggml_backend_tensor_get_async
                              (lVar19,lVar30,this->logits + local_1f8 * local_158._64_8_,0);
                  }
                }
                if ((lVar18 != 0) && (0 < this->n_outputs)) {
                  local_1d0 = ggml_backend_sched_get_tensor_backend
                                        ((this->sched)._M_t.
                                         super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>
                                         .super__Head_base<0UL,_ggml_backend_sched_*,_false>.
                                         _M_head_impl,lVar18);
                  if (local_1d0 == 0) {
                    uVar28 = 0x560;
LAB_0019002c:
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                               ,uVar28,"GGML_ASSERT(%s) failed",local_178);
                  }
                  switch((this->cparams).pooling_type) {
                  case LLAMA_POOLING_TYPE_NONE:
                    if (this->embd == (float *)0x0) {
                      uVar28 = 0x566;
                      local_178 = "embd != nullptr";
                      goto LAB_0019002c;
                    }
                    if ((long)this->n_outputs != 0) {
                      lVar30 = local_1f8 + this->n_outputs;
                      if (lVar29 < lVar30) {
                        uVar28 = 0x56a;
LAB_0019011f:
                        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                                   ,uVar28,"GGML_ASSERT(%s) failed",local_1f0);
                      }
                      lVar30 = lVar30 * local_1e8;
                      if (lVar30 - this->embd_size != 0 && (long)this->embd_size <= lVar30) {
                        uVar28 = 0x56b;
                        local_1f0 = "(n_outputs_prev + n_outputs)*n_embd <= (int64_t) embd_size";
                        goto LAB_0019011f;
                      }
                      ggml_backend_tensor_get_async
                                (local_1d0,lVar18,this->embd + local_1f8 * local_1e8,0);
                    }
                    break;
                  case LLAMA_POOLING_TYPE_MEAN:
                  case LLAMA_POOLING_TYPE_CLS:
                  case LLAMA_POOLING_TYPE_LAST:
                    if (local_1b8._12_4_ != 0) {
                      uVar27 = 0;
                      do {
                        local_200 = *local_188[uVar27];
                        p_Var6 = (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent;
                        p_Var22 = &p_Var2->_M_header;
                        for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                            p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < local_200]) {
                          if (local_200 <= (int)*(size_t *)(p_Var6 + 1)) {
                            p_Var22 = p_Var6;
                          }
                        }
                        p_Var25 = p_Var2;
                        if (((_Rb_tree_header *)p_Var22 != p_Var2) &&
                           (p_Var25 = (_Rb_tree_header *)p_Var22,
                           local_200 < (int)((_Rb_tree_header *)p_Var22)->_M_node_count)) {
                          p_Var25 = p_Var2;
                        }
                        if (p_Var25 == p_Var2) {
                          pmVar20 = std::
                                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    ::operator[](local_1e0,&local_200);
                          std::vector<float,_std::allocator<float>_>::resize(pmVar20,local_1e8);
                          pmVar20 = std::
                                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    ::operator[](local_1e0,&local_200);
                          ggml_backend_tensor_get_async
                                    (local_1d0,lVar18,
                                     (pmVar20->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_start,local_200 * local_160)
                          ;
                        }
                        uVar27 = uVar27 + 1;
                      } while (uVar27 < (ulong)local_1b8._8_8_ >> 0x20);
                    }
                    break;
                  case LLAMA_POOLING_TYPE_RANK:
                    if (local_1b8._12_4_ != 0) {
                      uVar27 = 0;
                      do {
                        local_200 = *local_188[uVar27];
                        p_Var6 = (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_parent;
                        p_Var22 = &p_Var2->_M_header;
                        for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                            p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < local_200]) {
                          if (local_200 <= (int)*(size_t *)(p_Var6 + 1)) {
                            p_Var22 = p_Var6;
                          }
                        }
                        p_Var25 = p_Var2;
                        if (((_Rb_tree_header *)p_Var22 != p_Var2) &&
                           (p_Var25 = (_Rb_tree_header *)p_Var22,
                           local_200 < (int)((_Rb_tree_header *)p_Var22)->_M_node_count)) {
                          p_Var25 = p_Var2;
                        }
                        if (p_Var25 == p_Var2) {
                          pmVar20 = std::
                                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    ::operator[](local_1e0,&local_200);
                          std::vector<float,_std::allocator<float>_>::resize(pmVar20,1);
                          pmVar20 = std::
                                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    ::operator[](local_1e0,&local_200);
                          ggml_backend_tensor_get_async
                                    (local_1d0,lVar18,
                                     (pmVar20->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data._M_start,(long)local_200 << 2);
                        }
                        uVar27 = uVar27 + 1;
                      } while (uVar27 < (ulong)local_1b8._8_8_ >> 0x20);
                    }
                    break;
                  case LLAMA_POOLING_TYPE_UNSPECIFIED:
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                               ,0x58f,"unknown pooling type");
                  }
                }
                local_1f8 = local_1f8 + this->n_outputs;
                uVar12 = local_1bc;
              }
              else if (gVar16 == GGML_STATUS_ALLOC_FAILED) {
                uVar12 = 0xfffffffe;
              }
              else {
                uVar12 = 2;
                if (gVar16 != GGML_STATUS_ABORTED) {
                  uVar12 = 0xfffffffd;
                }
              }
              if ((long *)CONCAT44(local_158._4_4_,local_158._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_158._4_4_,local_158._0_4_) + 8))();
              }
            }
            else {
              uVar12 = 1;
              bVar10 = false;
              llama_log_internal(GGML_LOG_LEVEL_WARN,
                                 "%s: failed to find KV cache slot for ubatch of size %d\n","decode"
                                 ,local_1b8._4_4_);
            }
            lVar30 = local_1c8;
          } while (bVar10);
        }
        (*(local_1d8->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[9])();
        if ((pointer)local_d0.logits.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.logits.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.logits.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.logits.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((__node_base_ptr)
            local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (__node_base_ptr)0x0) {
          operator_delete(local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return uVar12;
        }
        operator_delete(local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return uVar12;
      }
      pcVar23 = 
      "(cparams.causal_attn || cparams.n_ubatch >= n_tokens_all) && \"non-causal attention requires n_ubatch >= n_tokens\""
      ;
      uVar28 = 0x4c8;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
             ,uVar28,"GGML_ASSERT(%s) failed",pcVar23);
}

Assistant:

int llama_context::decode(llama_batch & inp_batch) {
    if (inp_batch.n_tokens == 0) {
        LLAMA_LOG_ERROR("%s: n_tokens == 0\n", __func__);
        return -1;
    }

    // temporary allocate memory for the input batch if needed
    // TODO: this is incorrect for multiple sequences because pos_max() is the maximum across all sequences
    llama_batch_allocr batch_allocr(inp_batch, inp_batch.pos ? -1 : kv_self->pos_max() + 1);

    const llama_batch & batch = batch_allocr.batch;

    const auto & vocab   = model.vocab;
    const auto & hparams = model.hparams;

    const int32_t n_vocab = vocab.n_tokens();

    const int64_t n_tokens_all = batch.n_tokens;
    const int64_t n_embd       = hparams.n_embd;

    llama_kv_cache_guard kv_guard(kv_self.get());

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd)); // NOLINT

    if (batch.token) {
        for (int64_t i = 0; i < n_tokens_all; ++i) {
            if (batch.token[i] < 0 || (uint32_t) batch.token[i] >= model.vocab.n_tokens()) {
                LLAMA_LOG_ERROR("%s: invalid token[%" PRId64 "] = %d\n", __func__, i, batch.token[i]);
                throw std::runtime_error("invalid token");
            }
        }
    }

    GGML_ASSERT(n_tokens_all <= cparams.n_batch);

    GGML_ASSERT((cparams.causal_attn || cparams.n_ubatch >= n_tokens_all) && "non-causal attention requires n_ubatch >= n_tokens");

    if (t_compute_start_us == 0) {
        t_compute_start_us = ggml_time_us();
    }
    n_queued_tokens += n_tokens_all;

    // this indicates we are doing pooled embedding, so we ignore batch.logits and output all tokens
    const bool embd_pooled = cparams.embeddings && cparams.pooling_type != LLAMA_POOLING_TYPE_NONE;

    embd_seq.clear();

    int64_t n_outputs_all = 0;

    // count outputs
    if (batch.logits && !embd_pooled) {
        for (uint32_t i = 0; i < n_tokens_all; ++i) {
            n_outputs_all += batch.logits[i] != 0;
        }
    } else if (logits_all || embd_pooled) {
        n_outputs_all = n_tokens_all;
    } else {
        // keep last output only
        n_outputs_all = 1;
    }

    const bool logits_all = n_outputs_all == n_tokens_all;

    sbatch.from_batch(batch, n_embd,
            /* simple_split */ !kv_self->recurrent,
            /* logits_all   */ logits_all);

    // reserve output buffer
    if (output_reserve(n_outputs_all) < n_outputs_all) {
        LLAMA_LOG_ERROR("%s: could not reserve space for batch with %" PRId64 " outputs\n", __func__, n_outputs_all);
        return -2;
    };

    // handle any pending defrags/shifts
    kv_self_update();

    int64_t n_outputs_prev = 0;

    while (sbatch.n_tokens > 0) {
        llama_ubatch ubatch = llama_ubatch();

        const auto & n_ubatch = cparams.n_ubatch;

        if (kv_self->recurrent) {
            if (embd_pooled) {
                // Pooled embeddings cannot be split across ubatches (yet)
                ubatch = sbatch.split_seq(cparams.n_ubatch);
            } else {
                // recurrent model architectures are easier to implement
                // with equal-length sequences
                ubatch = sbatch.split_equal(cparams.n_ubatch);
            }
        } else {
            ubatch = sbatch.split_simple(n_ubatch);
        }

        // count the outputs in this u_batch
        {
            int32_t n_outputs_new = 0;

            if (n_outputs_all == n_tokens_all) {
                n_outputs_new = ubatch.n_tokens;
            } else {
                GGML_ASSERT(ubatch.output);
                for (uint32_t i = 0; i < ubatch.n_tokens; i++) {
                    n_outputs_new += (int32_t) (ubatch.output[i] != 0);
                }
            }

            // needs to happen before the graph is built
            n_outputs = n_outputs_new;
        }

        // find KV slot
        {
            if (!kv_self->find_slot(ubatch)) {
                LLAMA_LOG_WARN("%s: failed to find KV cache slot for ubatch of size %d\n", __func__, ubatch.n_tokens);

                return 1;
            }

            if (!kv_self->recurrent) {
                // a heuristic, to avoid attending the full cache if it is not yet utilized
                // after enough generations, the benefit from this heuristic disappears
                // if we start defragmenting the cache, the benefit from this will be more important
                const uint32_t pad = kv_self->get_padding(cparams);
                kv_self->n = std::min(kv_self->size, std::max(pad, GGML_PAD(kv_self->cell_max(), pad)));
            }
        }

        //printf("kv_self.n = %5d, kv_self.used = %5d, kv_self.head = %5d\n", kv_self->n, kv_self->used, kv_self->head);

        ggml_backend_sched_reset(sched.get());
        ggml_backend_sched_set_eval_callback(sched.get(), cparams.cb_eval, cparams.cb_eval_user_data);

        auto * gf = graph_init();
        auto res = graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_DECODER);

        // LLAMA_LOG_INFO("graph build time: %.3f ms (%d nodes, %d leafs)\n", (ggml_time_us() - t_start_us)/1000.0, gf->n_nodes, gf->n_leafs);

        ggml_backend_sched_alloc_graph(sched.get(), gf);

        res->set_inputs(&ubatch);

        const auto compute_status = graph_compute(gf, ubatch.n_tokens > 1);
        if (compute_status != GGML_STATUS_SUCCESS) {
            switch (compute_status) {
                case GGML_STATUS_ABORTED:
                    return 2;
                case GGML_STATUS_ALLOC_FAILED:
                    return -2;
                case GGML_STATUS_FAILED:
                default:
                    return -3;
            }
        }

        // plot the computation graph in dot format (for debugging purposes)
        //if (n_past%100 == 0) {
        //    ggml_graph_dump_dot(gf, NULL, "llama.dot");
        //}

        auto * t_logits = cparams.embeddings ? nullptr         : res->get_logits();
        auto * t_embd   = cparams.embeddings ? res->get_embd() : nullptr;

        if (t_embd && res->get_embd_pooled()) {
            t_embd = res->get_embd_pooled();
        }

        // extract logits
        if (t_logits && n_outputs > 0) {
            ggml_backend_t backend_res = ggml_backend_sched_get_tensor_backend(sched.get(), t_logits);
            GGML_ASSERT(backend_res != nullptr);
            GGML_ASSERT(logits != nullptr);

            float * logits_out = logits + n_outputs_prev*n_vocab;

            if (n_outputs) {
                GGML_ASSERT( n_outputs_prev + n_outputs <= n_outputs_all);
                GGML_ASSERT((n_outputs_prev + n_outputs)*n_vocab <= (int64_t) logits_size);
                ggml_backend_tensor_get_async(backend_res, t_logits, logits_out, 0, n_outputs*n_vocab*sizeof(float));
            }
        }

        // extract embeddings
        if (t_embd && n_outputs > 0) {
            ggml_backend_t backend_embd = ggml_backend_sched_get_tensor_backend(sched.get(), t_embd);
            GGML_ASSERT(backend_embd != nullptr);

            switch (cparams.pooling_type) {
                case LLAMA_POOLING_TYPE_NONE:
                    {
                        // extract token embeddings
                        GGML_ASSERT(embd != nullptr);
                        float * embd_out = embd + n_outputs_prev*n_embd;

                        if (n_outputs) {
                            GGML_ASSERT( n_outputs_prev + n_outputs <= n_outputs_all);
                            GGML_ASSERT((n_outputs_prev + n_outputs)*n_embd <= (int64_t) embd_size);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_out, 0, n_outputs*n_embd*sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_MEAN:
                case LLAMA_POOLING_TYPE_CLS:
                case LLAMA_POOLING_TYPE_LAST:
                    {
                        // extract sequence embeddings (cleared before processing each batch)
                        auto & embd_seq_out = embd_seq;

                        for (uint32_t s = 0; s < ubatch.n_seqs; ++s) {
                            const llama_seq_id seq_id = ubatch.seq_id[s][0];
                            if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                                continue;
                            }
                            embd_seq_out[seq_id].resize(n_embd);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (n_embd*seq_id)*sizeof(float), n_embd*sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_RANK:
                    {
                        // extract the rerank score - a single float per sequence
                        auto & embd_seq_out = embd_seq;

                        for (uint32_t s = 0; s < ubatch.n_seqs; ++s) {
                            const llama_seq_id seq_id = ubatch.seq_id[s][0];
                            if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                                continue;
                            }
                            embd_seq_out[seq_id].resize(1);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (seq_id)*sizeof(float), sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_UNSPECIFIED:
                    {
                        GGML_ABORT("unknown pooling type");
                    }
            }
        }

        n_outputs_prev += n_outputs;
    }

    // finalize the batch processing
    kv_guard.commit();

    // set output mappings
    {
        bool sorted_output = true;

        GGML_ASSERT(sbatch.out_ids.size() == (size_t) n_outputs_all);

        for (int64_t i = 0; i < n_outputs_all; ++i) {
            int64_t out_id = sbatch.out_ids[i];
            output_ids[out_id] = i;
            if (out_id != i) {
                sorted_output = false;
            }
        }

        if (sorted_output) {
            sbatch.out_ids.clear();
        }
    }

    // set to total number of outputs in the batch, for use in llama_get_logits_ith
    n_outputs = n_outputs_all;

    // wait for the computation to finish (automatically done when obtaining the model output)
    //synchronize();

    // decide if we need to defrag the kv cache
    if (cparams.causal_attn && cparams.defrag_thold > 0.0f) {
        // - do not defrag small contexts (i.e. < 2048 tokens)
        // - count the padding towards the number of used tokens
        const float fragmentation = kv_self->n >= 2048 ? std::max(0.0f, 1.0f - float(kv_self->used + kv_self->get_padding(cparams))/float(kv_self->n)) : 0.0f;

        // queue defragmentation for next llama_kv_cache_update
        if (fragmentation > cparams.defrag_thold) {
            LLAMA_LOG_DEBUG("%s: fragmentation: %.2f - requesting defrag\n", __func__, fragmentation);

            kv_self->defrag();
        }
    }

    // Reset state for the next token before backend sync, to allow the CPU activities in the reset to
    // overlap with device computation.
    ggml_backend_sched_reset(sched.get());

    return 0;
}